

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

void __thiscall testbench::memory::add_RAM(memory *this,uint start_address,uint size)

{
  general_RAM *this_00;
  shared_ptr<testbench::address_range> local_48 [2];
  undefined1 local_28 [8];
  shared_ptr<testbench::address_range> RAM;
  uint size_local;
  uint start_address_local;
  memory *this_local;
  
  RAM.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = size;
  RAM.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = start_address;
  std::shared_ptr<testbench::address_range>::shared_ptr
            ((shared_ptr<testbench::address_range> *)local_28);
  this_00 = (general_RAM *)operator_new(0x28);
  anon_unknown_2::general_RAM::general_RAM
            (this_00,RAM.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_,
             (uint)RAM.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
  std::__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>::
  reset<testbench::address_range>
            ((__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> *)local_28,
             (address_range *)this_00);
  std::shared_ptr<testbench::address_range>::shared_ptr
            (local_48,(shared_ptr<testbench::address_range> *)local_28);
  add_range(this,local_48);
  std::shared_ptr<testbench::address_range>::~shared_ptr(local_48);
  std::shared_ptr<testbench::address_range>::~shared_ptr
            ((shared_ptr<testbench::address_range> *)local_28);
  return;
}

Assistant:

void memory::add_RAM(unsigned start_address, unsigned size)
{
    std::shared_ptr<address_range> RAM;
    
    RAM.reset((address_range*)(new general_RAM(start_address, size)));
    add_range(std::move(RAM));
}